

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O2

void __thiscall
qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::apply
          (QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *this,Op op,
          int nbQubits,vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,
          int offset)

{
  QObject<std::complex<float>_> *pQVar1;
  __normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>_>
  __tmp;
  pointer puVar2;
  
  if (op == NoTrans) {
    for (puVar2 = (this->gates_).
                  super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar2 != (this->gates_).
                  super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
      pQVar1 = (puVar2->_M_t).
               super___uniq_ptr_impl<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_qclab::QObject<std::complex<float>_>_*,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
               .super__Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false>._M_head_impl;
      (*pQVar1->_vptr_QObject[8])
                (pQVar1,0x4e,(ulong)(uint)nbQubits,vector,(ulong)(uint)(this->offset_ + offset));
    }
  }
  else {
    for (puVar2 = (this->gates_).
                  super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        puVar2 != (this->gates_).
                  super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar2 = puVar2 + -1) {
      pQVar1 = puVar2[-1]._M_t.
               super___uniq_ptr_impl<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_qclab::QObject<std::complex<float>_>_*,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
               .super__Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false>._M_head_impl;
      (*pQVar1->_vptr_QObject[8])
                (pQVar1,(ulong)(uint)(int)(char)op,(ulong)(uint)nbQubits,vector,
                 (ulong)(uint)(this->offset_ + offset));
    }
  }
  return;
}

Assistant:

void apply( Op op , const int nbQubits , std::vector< T >& vector ,
                  const int offset = 0 ) const override {
        if ( op == Op::NoTrans ) {
          // NoTrans
          for ( auto it = begin(); it != end(); ++it ) {
            (*it)->apply( op , nbQubits , vector , offset_ + offset ) ;
          }
        } else {
          // [Conj]Trans
          for ( auto it = rbegin(); it != rend(); ++it ) {
            (*it)->apply( op , nbQubits , vector , offset_ + offset ) ;
          }
        }
      }